

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O0

difference_type
ft::distance<ft::treeIterator<int,ft::allocator<ft::treeNode<int>>>>
          (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first,
          treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last,type *param_3)

{
  difference_type dVar1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_50;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_38;
  type *local_20;
  type *param_2_local;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last_local;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first_local;
  
  local_20 = param_3;
  param_2_local = last;
  last_local = first;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator(&local_38,first);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator(&local_50,last);
  dVar1 = _distance<ft::treeIterator<int,ft::allocator<ft::treeNode<int>>>>(&local_38,&local_50);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_50);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_38);
  return dVar1;
}

Assistant:

typename ft::iterator_traits<InputIter>::difference_type
	distance(InputIter first, InputIter last,
			 typename ft::_void_t<typename ft::iterator_traits<InputIter>::iterator_category>::type * = 0) {
	return ft::_distance(first, last, typename ft::iterator_traits<InputIter>::iterator_category());
}